

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O2

void __thiscall Float_Overflow_Test::TestBody(Float_Overflow_Test *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"1.0e1000",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-1.0e1000",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(Float, Overflow) {
    test_error("1.0e1000");
    test_error("-1.0e1000");
}